

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O0

QTouchEventWidgetSequence * __thiscall
QTest::QTouchEventWidgetSequence::move
          (QTouchEventWidgetSequence *this,int touchId,QPoint *pt,QWidget *widget)

{
  long lVar1;
  QPointF arg;
  QWidget *widget_00;
  QTouchEventWidgetSequence *in_RCX;
  QTouchEventWidgetSequence *in_RDI;
  long in_FS_OFFSET;
  QEventPoint *p;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  widget_00 = (QWidget *)QTest::QTouchEventSequence::point((int)in_RDI);
  pQVar2 = widget_00;
  mapToScreen(in_RCX,widget_00,(QPoint *)widget_00);
  QPointF::QPointF((QPointF *)widget_00,(QPoint *)in_RDI);
  arg.yp = (qreal)pQVar2;
  arg.xp = (qreal)widget_00;
  QMutableEventPoint::setGlobalPosition((QEventPoint *)in_RDI,arg);
  QMutableEventPoint::setState((QEventPoint *)widget_00,(State)((ulong)in_RDI >> 0x38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTouchEventWidgetSequence& QTouchEventWidgetSequence::move(int touchId, const QPoint &pt, QWidget *widget)
{
    auto &p = point(touchId);
    QMutableEventPoint::setGlobalPosition(p, mapToScreen(widget, pt));
    QMutableEventPoint::setState(p, QEventPoint::State::Updated);
    return *this;
}